

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_assembler.c
# Opt level: O0

int parse_instruction_token(Context_conflict *ctx,Token token)

{
  char *__src;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint local_98;
  int local_94;
  int i;
  uint32 insttoks;
  int tokcount;
  Instruction_conflict *instruction;
  undefined1 local_78 [4];
  int len;
  char opstr [32];
  char *opcode_string;
  size_t i_1;
  uint origtokenlen;
  char *origtoken;
  uint32 local_28;
  uint32 opcode;
  uint32 controls;
  int predicated;
  int coissue;
  Token token_local;
  Context_conflict *ctx_local;
  
  controls = 0;
  opcode = 0;
  predicated = token;
  _coissue = ctx;
  if (token == 0x2b) {
    controls = 1;
    predicated = nexttoken(ctx);
  }
  if (predicated == 0x101) {
    local_28 = 0;
    origtoken._4_4_ = 0x42;
    __src = _coissue->token;
    uVar3 = _coissue->tokenlen;
    iVar1 = shader_version_atleast(_coissue,'\x01','\x04');
    if ((iVar1 == 0) && (iVar1 = check_token_segment(_coissue,"TEX"), iVar1 != 0)) {
      local_28 = 0;
    }
    else {
      iVar1 = check_token_segment(_coissue,"TEXLDP");
      if (iVar1 == 0) {
        iVar1 = check_token_segment(_coissue,"TEXLDB");
        if (iVar1 == 0) {
          for (opcode_string = (char *)0x0; opcode_string < (char *)0x61;
              opcode_string = opcode_string + 1) {
            if ((instructions[(long)opcode_string].opcode_string != (char *)0x0) &&
               (iVar1 = check_token_segment(_coissue,instructions[(long)opcode_string].opcode_string
                                           ), iVar1 != 0)) {
              if ((_coissue->tokenlen == 0) || (*_coissue->token == '_')) break;
              _coissue->token = __src;
              _coissue->tokenlen = uVar3;
            }
          }
          origtoken._4_4_ = (uint)opcode_string;
          if (origtoken._4_4_ == 0x28) {
            iVar1 = parse_condition(_coissue,&local_28);
            if (iVar1 != 0) {
              origtoken._4_4_ = 0x29;
            }
          }
          else if (origtoken._4_4_ == 0x2c) {
            iVar1 = parse_condition(_coissue,&local_28);
            if (iVar1 != 0) {
              origtoken._4_4_ = 0x2d;
            }
          }
          else if ((origtoken._4_4_ == 0x5e) &&
                  (iVar1 = parse_condition(_coissue,&local_28), iVar1 == 0)) {
            fail(_coissue,"SETP requires a condition");
          }
        }
        else {
          local_28 = 2;
        }
      }
      else {
        local_28 = 1;
      }
    }
    if ((origtoken._4_4_ == 0x61) || ((_coissue->tokenlen != 0 && (*_coissue->token != '_')))) {
      iVar1 = Min(0x1f,uVar3);
      memcpy(local_78,__src,(long)iVar1);
      local_78[iVar1] = 0;
      failf(_coissue,"Unknown instruction \'%s\'",local_78);
      ctx_local._4_4_ = 0;
    }
    else {
      _coissue->tokenbufpos = 0;
      iVar1 = (*instructions[origtoken._4_4_].parse_args)(_coissue);
      iVar2 = shader_version_atleast(_coissue,'\x02','\0');
      if (iVar2 == 0) {
        local_98 = 0;
      }
      else {
        local_98 = iVar1 - 1;
      }
      uVar3 = 0;
      if (controls != 0) {
        uVar3 = 0x40000000;
      }
      uVar4 = 0;
      if (opcode != 0) {
        uVar4 = 0x10000000;
      }
      output_token(_coissue,origtoken._4_4_ & 0xffff | (local_28 & 0xff) << 0x10 |
                            (local_98 & 0xf) << 0x18 | uVar3 | uVar4);
      for (local_94 = 0; local_94 < iVar1 + -1; local_94 = local_94 + 1) {
        output_token(_coissue,_coissue->tokenbuf[local_94]);
      }
      ctx_local._4_4_ = 1;
    }
  }
  else {
    fail(_coissue,"Expected instruction");
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int parse_instruction_token(Context *ctx, Token token)
{
    int coissue = 0;
    int predicated = 0;

    if (token == ((Token) '+'))
    {
        coissue = 1;
        token = nexttoken(ctx);
    } // if

    if (token != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Expected instruction");
        return 0;
    } // if

    uint32 controls = 0;
    uint32 opcode = OPCODE_TEXLD;
    const char *origtoken = ctx->token;
    const unsigned int origtokenlen = ctx->tokenlen;

    // "TEX" is only meaningful in ps_1_1.
    if ((!shader_version_atleast(ctx, 1, 4)) && (check_token_segment(ctx, "TEX")))
        controls = 0;

    // This might need to be TEXLD instead of TEXLDP.
    else if (check_token_segment(ctx, "TEXLDP"))
        controls = CONTROL_TEXLDP;

    // This might need to be TEXLD instead of TEXLDB.
    else if (check_token_segment(ctx, "TEXLDB"))
        controls = CONTROL_TEXLDB;

    else  // find the instruction.
    {
        size_t i;
        for (i = 0; i < STATICARRAYLEN(instructions); i++)
        {
            const char *opcode_string = instructions[i].opcode_string;
            if (opcode_string == NULL)
                continue;  // skip this.
            else if (!check_token_segment(ctx, opcode_string))
                continue;  // not us.
            else if ((ctx->tokenlen > 0) && (*ctx->token != '_'))
            {
                ctx->token = origtoken;
                ctx->tokenlen = origtokenlen;
                continue;  // not the match: TEXLD when we wanted TEXLDL, etc.
            } // if

            break;  // found it!
        } // for

        opcode = (uint32) i;

        // This might need to be IFC instead of IF.
        if (opcode == OPCODE_IF)
        {
            if (parse_condition(ctx, &controls))
                opcode = OPCODE_IFC;
        } // if

        // This might need to be BREAKC instead of BREAK.
        else if (opcode == OPCODE_BREAK)
        {
            if (parse_condition(ctx, &controls))
                opcode = OPCODE_BREAKC;
        } // else if

        // SETP has a conditional code, always.
        else if (opcode == OPCODE_SETP)
        {
            if (!parse_condition(ctx, &controls))
                fail(ctx, "SETP requires a condition");
        } // else if
    } // else

    if ( (opcode == STATICARRAYLEN(instructions)) ||
         ((ctx->tokenlen > 0) && (ctx->token[0] != '_')) )
    {
        char opstr[32];
        const int len = Min(sizeof (opstr) - 1, origtokenlen);
        memcpy(opstr, origtoken, len);
        opstr[len] = '\0';
        failf(ctx, "Unknown instruction '%s'", opstr);
        return 0;
    } // if

    const Instruction *instruction = &instructions[opcode];

    // !!! FIXME: predicated instructions

    ctx->tokenbufpos = 0;

    const int tokcount = instruction->parse_args(ctx);

    // insttoks bits are reserved and should be zero if < SM2.
    const uint32 insttoks = shader_version_atleast(ctx, 2, 0) ? tokcount-1 : 0;

    // write out the instruction token.
    output_token(ctx, ((opcode & 0xFFFF) << 0) |
                      ((controls & 0xFF) << 16) |
                      ((insttoks & 0xF) << 24) |
                      ((coissue) ? 0x40000000 : 0x00000000) |
                      ((predicated) ? 0x10000000 : 0x00000000) );

    // write out the argument tokens.
    int i;
    for (i = 0; i < (tokcount-1); i++)
        output_token(ctx, ctx->tokenbuf[i]);

    return 1;
}